

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void __thiscall TPZFMatrix<long>::~TPZFMatrix(TPZFMatrix<long> *this)

{
  ~TPZFMatrix(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

TPZFMatrix<TVar>::~TPZFMatrix() {
    if(fElem && fElem != fGiven) delete[]( fElem );
    fElem = 0;
    fSize = 0;
}